

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

axbStatus_t axbScalarDestroy(axbScalar_s *scalar)

{
  axbScalar_s *scalar_local;
  
  if (scalar->init == 0xdad1b) {
    scalar->init = scalar->init + 1;
    (*scalar->memBackend->op_free)(scalar->data,(void *)0x0);
    free(scalar->name);
    free(scalar);
    scalar_local._4_4_ = 0;
  }
  else {
    scalar_local._4_4_ = 0xdad1b;
  }
  return scalar_local._4_4_;
}

Assistant:

axbStatus_t axbScalarDestroy(struct axbScalar_s *scalar)
{
  if (scalar->init != 896283) return 896283;
  scalar->init += 1;

  scalar->memBackend->op_free(scalar->data, NULL);
  free(scalar->name);
  free(scalar);
  return 0;
}